

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O1

void __thiscall deqp::gls::RandomShaderProgram::refreshUniforms(RandomShaderProgram *this)

{
  long lVar1;
  long lVar2;
  ConstStridedValueAccess<64> local_50;
  StridedValueRead<1> local_40;
  
  if (0 < this->m_numUnifiedUniforms) {
    lVar2 = 0x24;
    lVar1 = 0;
    do {
      local_40.m_type = &this->m_unifiedUniforms[lVar1]->m_variable->m_type;
      local_40.m_value =
           (Scalar *)
           ((long)&(((this->super_ShaderProgram).m_uniforms.
                     super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                     _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar2);
      local_50 = (ConstStridedValueAccess<64>)
                 rsg::ExecutionContext::getValue(&this->m_execCtx,(Variable *)local_40.m_type);
      rsg::StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_50,&local_40);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x70;
    } while (lVar1 < this->m_numUnifiedUniforms);
  }
  return;
}

Assistant:

void RandomShaderProgram::refreshUniforms (void) const
{
	DE_ASSERT(m_numUnifiedUniforms == (int)m_uniforms.size());

	for (int uniformNdx = 0; uniformNdx < m_numUnifiedUniforms; uniformNdx++)
	{
		const rsg::Variable*		uniformVar	= m_unifiedUniforms[uniformNdx]->getVariable();
		const rsg::VariableType&	uniformType	= uniformVar->getType();
		const sglr::UniformSlot&	uniformSlot	= m_uniforms[uniformNdx];

		m_execCtx.getValue(uniformVar) = rsg::ConstValueAccess(uniformType, (const rsg::Scalar*)&uniformSlot.value).value();
	}
}